

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * __thiscall
cxxopts::(anonymous_namespace)::format_option_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,HelpOptionDetails *o)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a2;
  allocator local_a1;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator local_2a;
  byte local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *l;
  string *s;
  HelpOptionDetails *o_local;
  String *result;
  
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x20);
  local_29 = 0;
  l = (string *)this;
  s = (string *)this;
  o_local = (HelpOptionDetails *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"  ",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pbVar2 = toLocalString<std::__cxx11::string_const&>(l);
    std::operator+(&local_60,"-",pbVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"   ");
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pbVar2 = toLocalString<std::__cxx11::string_const&>(local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&arg.field_2 + 8)," --",pbVar2);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(arg.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
  }
  uVar1 = std::__cxx11::string::empty();
  local_a2 = 0;
  if ((uVar1 & 1) == 0) {
    pbVar2 = toLocalString<std::__cxx11::string_const&>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &s[5].field_2);
    std::__cxx11::string::string((string *)local_a0,(string *)pbVar2);
  }
  else {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string((string *)local_a0,"arg",&local_a1);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if ((s[6].field_2._M_local_buf[1] & 1U) == 0) {
    if ((s[4]._M_string_length & 1) == 0) {
      std::operator+(&local_148," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
    }
    else {
      std::operator+(&local_128," [=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_108,&local_128,"(=");
      pbVar2 = toLocalString<std::__cxx11::string_const&>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &s[4].field_2);
      std::operator+(&local_e8,&local_108,pbVar2);
      std::operator+(&local_c8,&local_e8,")]");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  local_29 = 1;
  std::__cxx11::string::~string((string *)local_a0);
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String
    format_option
    (
      const HelpOptionDetails& o
    )
    {
      const auto& s = o.s;
      const auto& l = o.l;

      String result = "  ";

      if (!s.empty())
      {
        result += "-" + toLocalString(s);
        if (!l.empty())
        {
          result += ",";
        }
      }
      else
      {
        result += "   ";
      }

      if (!l.empty())
      {
        result += " --" + toLocalString(l);
      }

      auto arg = !o.arg_help.empty() ? toLocalString(o.arg_help) : "arg";

      if (!o.is_boolean)
      {
        if (o.has_implicit)
        {
          result += " [=" + arg + "(=" + toLocalString(o.implicit_value) + ")]";
        }
        else
        {
          result += " " + arg;
        }
      }

      return result;
    }